

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

int __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeScaleExp(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vec,DataArray<int> *oldScaleExp)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real eps;
  uint uVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  uint *puVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  soplex *psVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  long lVar15;
  char cVar16;
  byte bVar17;
  int scaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_3bc;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  soplex local_138 [112];
  int local_c8;
  undefined1 local_c4;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar17 = 0;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_3b8,0.0);
  if (0 < vec->memused) {
    lVar8 = 0x80;
    lVar15 = 0;
    do {
      piVar6 = (int *)((long)(vec->m_elem->val).m_backend.data._M_elems + lVar8);
      piVar9 = piVar6 + -0x20;
      psVar13 = local_138;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(int *)psVar13 = *piVar9;
        piVar9 = piVar9 + (ulong)bVar17 * -2 + 1;
        psVar13 = psVar13 + (ulong)bVar17 * -8 + 4;
      }
      local_c8 = piVar6[-4];
      local_c4 = (undefined1)piVar6[-3];
      local_c0 = *(undefined8 *)(piVar6 + -2);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_2b8,local_138,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)oldScaleExp->data[*piVar6],(int)oldScaleExp->data);
      iVar3 = local_2b8.m_backend.prec_elem;
      fVar2 = local_2b8.m_backend.fpclass;
      iVar5 = local_2b8.m_backend.exp;
      uVar1 = local_2b8.m_backend.data._M_elems[0];
      cVar16 = local_2b8.m_backend.neg;
      if (local_2b8.m_backend.neg == true) {
        cVar16 = local_2b8.m_backend.fpclass == cpp_dec_float_finite &&
                 local_2b8.m_backend.data._M_elems[0] == 0;
      }
      puVar11 = local_2b8.m_backend.data._M_elems + 1;
      puVar10 = puVar11;
      pcVar12 = &local_238;
      for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar10;
        puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
      }
      local_338.m_backend.data._M_elems[0] = local_2b8.m_backend.data._M_elems[0];
      puVar10 = local_338.m_backend.data._M_elems + 1;
      for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar10 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
        puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
      }
      local_338.m_backend.exp = iVar5;
      local_338.m_backend.neg = (bool)cVar16;
      local_338.m_backend.fpclass = fVar2;
      local_338.m_backend.prec_elem = iVar3;
      pcVar12 = &local_3b8;
      pnVar14 = &local_1b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_1b8.m_backend.exp = local_3b8.exp;
      local_1b8.m_backend.neg = local_3b8.neg;
      local_1b8.m_backend.fpclass = local_3b8.fpclass;
      local_1b8.m_backend.prec_elem = local_3b8.prec_elem;
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      eps = Tolerances::epsilon(this_00);
      bVar4 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_338,&local_1b8,eps);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (bVar4) {
        local_3b8.data._M_elems[0] = uVar1;
        pcVar12 = &local_238;
        puVar11 = local_3b8.data._M_elems + 1;
        for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar11 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
          puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
        }
        local_3b8.exp = iVar5;
        local_3b8.prec_elem = iVar3;
        local_3b8.fpclass = fVar2;
        local_3b8.neg = (bool)cVar16;
      }
      lVar15 = lVar15 + 1;
      lVar8 = lVar8 + 0x84;
    } while (lVar15 < vec->memused);
  }
  if (local_3b8.fpclass != cpp_dec_float_NaN) {
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 0x1c;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems[8] = 0;
    local_238.data._M_elems[9] = 0;
    local_238.data._M_elems[10] = 0;
    local_238.data._M_elems[0xb] = 0;
    local_238.data._M_elems[0xc] = 0;
    local_238.data._M_elems[0xd] = 0;
    local_238.data._M_elems[0xe] = 0;
    local_238.data._M_elems[0xf] = 0;
    local_238.data._M_elems[0x10] = 0;
    local_238.data._M_elems[0x11] = 0;
    local_238.data._M_elems[0x12] = 0;
    local_238.data._M_elems[0x13] = 0;
    local_238.data._M_elems[0x14] = 0;
    local_238.data._M_elems[0x15] = 0;
    local_238.data._M_elems[0x16] = 0;
    local_238.data._M_elems[0x17] = 0;
    local_238.data._M_elems[0x18] = 0;
    local_238.data._M_elems[0x19] = 0;
    local_238.data._M_elems._104_5_ = 0;
    local_238.data._M_elems[0x1b]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_238,0.0);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_3b8,&local_238);
    if (iVar5 == 0) {
      return 0;
    }
  }
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x1c;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems[0xe] = 0;
  local_238.data._M_elems[0xf] = 0;
  local_238.data._M_elems[0x10] = 0;
  local_238.data._M_elems[0x11] = 0;
  local_238.data._M_elems[0x12] = 0;
  local_238.data._M_elems[0x13] = 0;
  local_238.data._M_elems[0x14] = 0;
  local_238.data._M_elems[0x15] = 0;
  local_238.data._M_elems[0x16] = 0;
  local_238.data._M_elems[0x17] = 0;
  local_238.data._M_elems[0x18] = 0;
  local_238.data._M_elems[0x19] = 0;
  local_238.data._M_elems._104_5_ = 0;
  local_238.data._M_elems[0x1b]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_238,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_b8,&local_238,&local_3b8);
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x1c;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems[0xe] = 0;
  local_238.data._M_elems[0xf] = 0;
  local_238.data._M_elems[0x10] = 0;
  local_238.data._M_elems[0x11] = 0;
  local_238.data._M_elems[0x12] = 0;
  local_238.data._M_elems[0x13] = 0;
  local_238.data._M_elems[0x14] = 0;
  local_238.data._M_elems[0x15] = 0;
  local_238.data._M_elems[0x16] = 0;
  local_238.data._M_elems[0x17] = 0;
  local_238.data._M_elems[0x18] = 0;
  local_238.data._M_elems[0x19] = 0;
  local_238.data._M_elems._104_5_ = 0;
  local_238.data._M_elems[0x1b]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  boost::multiprecision::backends::eval_frexp<200u,int,void>(&local_238,&local_b8,&local_3bc);
  return local_3bc + -1;
}

Assistant:

int SPxScaler<R>::computeScaleExp(const SVectorBase<R>& vec,
                                  const DataArray<int>& oldScaleExp) const
{
   R maxi = 0.0;

   // find largest absolute value after applying existing scaling factors
   for(int i = 0; i < vec.size(); ++i)
   {
      R x = spxAbs(spxLdexp(vec.value(i), oldScaleExp[vec.index(i)]));

      if(GT(x, maxi, this->tolerances()->epsilon()))
         maxi = x;
   }

   // empty rows/cols are possible
   if(maxi == 0.0)
      return 0;
   // get exponent corresponding to new scaling factor
   else
   {
      int scaleExp;
      spxFrexp(R(1.0 / maxi), &(scaleExp));
      return scaleExp - 1;
   }
}